

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

void af_latin_hints_link_segments
               (AF_GlyphHints hints,FT_UInt width_count,AF_WidthRec *widths,AF_Dimension dim)

{
  uint uVar1;
  AF_Segment_conflict pAVar2;
  AF_Segment pAVar3;
  AF_AxisHintsRec *pAVar4;
  AF_Segment_conflict pAVar5;
  long lVar6;
  FT_Pos delta;
  FT_Pos score;
  FT_Pos dist_demerit;
  FT_Pos dist;
  FT_Pos len;
  FT_Pos max;
  FT_Pos min;
  FT_Pos pos2;
  FT_Pos pos1;
  AF_Segment_conflict seg2;
  AF_Segment_conflict seg1;
  FT_Pos max_width;
  FT_Pos dist_score;
  FT_Pos len_score;
  FT_Pos len_threshold;
  AF_Segment_conflict segment_limit;
  AF_Segment_conflict segments;
  AF_AxisHints axis;
  AF_Dimension dim_local;
  AF_WidthRec *widths_local;
  FT_UInt width_count_local;
  AF_GlyphHints hints_local;
  
  pAVar4 = hints->axis + dim;
  pAVar2 = pAVar4->segments;
  pAVar5 = pAVar2 + pAVar4->num_segments;
  if (width_count == 0) {
    seg1 = (AF_Segment_conflict)0x0;
  }
  else {
    seg1 = (AF_Segment_conflict)widths[width_count - 1].org;
  }
  len_score = ((ulong)*(uint *)&hints->metrics[1].style_class << 3) / 0x800;
  if (len_score == 0) {
    len_score = 1;
  }
  uVar1 = *(uint *)&hints->metrics[1].style_class;
  for (seg2 = pAVar2; seg2 < pAVar5; seg2 = seg2 + 1) {
    pos1 = (FT_Pos)pAVar2;
    if ((int)seg2->dir == pAVar4->major_dir) {
      for (; (ulong)pos1 < pAVar5; pos1 = pos1 + 0x50) {
        if (((int)seg2->dir + (int)*(char *)(pos1 + 1) == 0) &&
           ((long)seg2->pos < (long)*(short *)(pos1 + 2))) {
          max = (FT_Pos)seg2->min_coord;
          len = (FT_Pos)seg2->max_coord;
          if (max < *(short *)(pos1 + 6)) {
            max = (FT_Pos)*(short *)(pos1 + 6);
          }
          if (*(short *)(pos1 + 8) < len) {
            len = (FT_Pos)*(short *)(pos1 + 8);
          }
          if (len_score <= len - max) {
            score = (long)*(short *)(pos1 + 2) - (long)seg2->pos;
            if (seg1 != (AF_Segment_conflict)0x0) {
              lVar6 = (score * 0x400) / (long)seg1 + -0x400;
              if (lVar6 < 0x2711) {
                if (lVar6 < 1) {
                  score = 0;
                }
                else {
                  score = (lVar6 * lVar6) / 3000;
                }
              }
              else {
                score = 32000;
              }
            }
            lVar6 = score + (long)(((ulong)uVar1 * 6000) / 0x800) / (len - max);
            if (lVar6 < seg2->score) {
              seg2->score = lVar6;
              seg2->link = (AF_Segment)pos1;
            }
            if (lVar6 < *(long *)(pos1 + 0x30)) {
              *(long *)(pos1 + 0x30) = lVar6;
              *(AF_Segment_conflict *)(pos1 + 0x20) = seg2;
            }
          }
        }
      }
    }
  }
  while (seg2 = pAVar2, seg2 < pAVar5) {
    pAVar3 = seg2->link;
    if ((pAVar3 != (AF_Segment)0x0) && (pAVar3->link != seg2)) {
      seg2->link = (AF_Segment)0x0;
      seg2->serif = pAVar3->link;
    }
    pAVar2 = seg2 + 1;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_latin_hints_link_segments( AF_GlyphHints  hints,
                                FT_UInt        width_count,
                                AF_WidthRec*   widths,
                                AF_Dimension   dim )
  {
    AF_AxisHints  axis          = &hints->axis[dim];
    AF_Segment    segments      = axis->segments;
    AF_Segment    segment_limit = segments + axis->num_segments;
    FT_Pos        len_threshold, len_score, dist_score, max_width;
    AF_Segment    seg1, seg2;


    if ( width_count )
      max_width = widths[width_count - 1].org;
    else
      max_width = 0;

    /* a heuristic value to set up a minimum value for overlapping */
    len_threshold = AF_LATIN_CONSTANT( hints->metrics, 8 );
    if ( len_threshold == 0 )
      len_threshold = 1;

    /* a heuristic value to weight lengths */
    len_score = AF_LATIN_CONSTANT( hints->metrics, 6000 );

    /* a heuristic value to weight distances (no call to    */
    /* AF_LATIN_CONSTANT needed, since we work on multiples */
    /* of the stem width)                                   */
    dist_score = 3000;

    /* now compare each segment to the others */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      if ( seg1->dir != axis->major_dir )
        continue;

      /* search for stems having opposite directions, */
      /* with seg1 to the `left' of seg2              */
      for ( seg2 = segments; seg2 < segment_limit; seg2++ )
      {
        FT_Pos  pos1 = seg1->pos;
        FT_Pos  pos2 = seg2->pos;


        if ( seg1->dir + seg2->dir == 0 && pos2 > pos1 )
        {
          /* compute distance between the two segments */
          FT_Pos  min = seg1->min_coord;
          FT_Pos  max = seg1->max_coord;
          FT_Pos  len;


          if ( min < seg2->min_coord )
            min = seg2->min_coord;

          if ( max > seg2->max_coord )
            max = seg2->max_coord;

          /* compute maximum coordinate difference of the two segments */
          /* (this is, how much they overlap)                          */
          len = max - min;
          if ( len >= len_threshold )
          {
            /*
             *  The score is the sum of two demerits indicating the
             *  `badness' of a fit, measured along the segments' main axis
             *  and orthogonal to it, respectively.
             *
             *  o The less overlapping along the main axis, the worse it
             *    is, causing a larger demerit.
             *
             *  o The nearer the orthogonal distance to a stem width, the
             *    better it is, causing a smaller demerit.  For simplicity,
             *    however, we only increase the demerit for values that
             *    exceed the largest stem width.
             */

            FT_Pos  dist = pos2 - pos1;

            FT_Pos  dist_demerit, score;


            if ( max_width )
            {
              /* distance demerits are based on multiples of `max_width'; */
              /* we scale by 1024 for getting more precision              */
              FT_Pos  delta = ( dist << 10 ) / max_width - ( 1 << 10 );


              if ( delta > 10000 )
                dist_demerit = 32000;
              else if ( delta > 0 )
                dist_demerit = delta * delta / dist_score;
              else
                dist_demerit = 0;
            }
            else
              dist_demerit = dist; /* default if no widths available */

            score = dist_demerit + len_score / len;

            /* and we search for the smallest score */
            if ( score < seg1->score )
            {
              seg1->score = score;
              seg1->link  = seg2;
            }

            if ( score < seg2->score )
            {
              seg2->score = score;
              seg2->link  = seg1;
            }
          }
        }
      }
    }

    /* now compute the `serif' segments, cf. explanations in `afhints.h' */
    for ( seg1 = segments; seg1 < segment_limit; seg1++ )
    {
      seg2 = seg1->link;

      if ( seg2 )
      {
        if ( seg2->link != seg1 )
        {
          seg1->link  = 0;
          seg1->serif = seg2->link;
        }
      }
    }
  }